

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NtkGetFanoutMax(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int i;
  int iVar3;
  
  iVar3 = 0;
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pAVar2 = Abc_NtkObj(pNtk,i);
    if (((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) &&
       (iVar1 = (pAVar2->vFanouts).nSize, iVar3 <= iVar1)) {
      iVar3 = iVar1;
    }
  }
  return iVar3;
}

Assistant:

int Abc_NtkGetFanoutMax( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, nFaninsMax = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( nFaninsMax < Abc_ObjFanoutNum(pNode) )
            nFaninsMax = Abc_ObjFanoutNum(pNode);
    }
    return nFaninsMax;
}